

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O0

void Ssc_GiaRandomPiPattern(Gia_Man_t *p,int nWords,Vec_Int_t *vPivot)

{
  int iVar1;
  word wVar2;
  word local_40;
  int local_30;
  int local_2c;
  int w;
  int i;
  word *pSimPi;
  Vec_Int_t *vPivot_local;
  int nWords_local;
  Gia_Man_t *p_local;
  
  Ssc_GiaResetPiPattern(p,nWords);
  _w = Gia_ObjSimPi(p,0);
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    if (iVar1 <= local_2c) break;
    if (vPivot == (Vec_Int_t *)0x0) {
      local_40 = Ssc_Random2();
    }
    else {
      iVar1 = Vec_IntEntry(vPivot,local_2c);
      local_40 = Ssc_Random1(iVar1);
    }
    *_w = local_40;
    for (local_30 = 1; local_30 < nWords; local_30 = local_30 + 1) {
      wVar2 = Ssc_Random();
      _w[local_30] = wVar2;
    }
    local_2c = local_2c + 1;
    _w = _w + nWords;
  }
  return;
}

Assistant:

void Ssc_GiaRandomPiPattern( Gia_Man_t * p, int nWords, Vec_Int_t * vPivot )
{
    word * pSimPi;
    int i, w;
    Ssc_GiaResetPiPattern( p, nWords );
    pSimPi = Gia_ObjSimPi( p, 0 );
    for ( i = 0; i < Gia_ManPiNum(p); i++, pSimPi += nWords )
    {
        pSimPi[0] = vPivot ? Ssc_Random1(Vec_IntEntry(vPivot, i)) : Ssc_Random2();
        for ( w = 1; w < nWords; w++ )
            pSimPi[w] = Ssc_Random();
//        if ( i < 10 )
//            Extra_PrintBinary( stdout, (unsigned *)pSimPi, 64 ), printf( "\n" );
    }
}